

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::add_include_once(CTcTokenizer *this,char *fname)

{
  int iVar1;
  size_t sVar2;
  tctok_incfile_t *ptVar3;
  
  iVar1 = find_include_once(this,fname);
  if (iVar1 == 0) {
    sVar2 = strlen(fname);
    ptVar3 = (tctok_incfile_t *)malloc(sVar2 + 0x10);
    strcpy(ptVar3->fname,fname);
    ptVar3->nxt = this->prev_includes_;
    this->prev_includes_ = ptVar3;
  }
  return;
}

Assistant:

void CTcTokenizer::add_include_once(const char *fname)
{
    tctok_incfile_t *prvinc;

    /* if the file is already in the list, don't add it again */
    if (find_include_once(fname))
        return;
    
    /* create a new entry for the filename */
    prvinc = (tctok_incfile_t *)t3malloc(sizeof(tctok_incfile_t)
                                         + strlen(fname));

    /* save the filename */
    strcpy(prvinc->fname, fname);
    
    /* link the new entry into our list */
    prvinc->nxt = prev_includes_;
    prev_includes_ = prvinc;
}